

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

void __thiscall
QDomEntityPrivate::QDomEntityPrivate
          (QDomEntityPrivate *this,QDomDocumentPrivate *d,QDomNodePrivate *parent,QString *aname,
          QString *pub,QString *sys,QString *notation)

{
  QDomNodePrivate::QDomNodePrivate(&this->super_QDomNodePrivate,d,parent);
  (this->super_QDomNodePrivate)._vptr_QDomNodePrivate =
       (_func_int **)&PTR__QDomEntityPrivate_00127440;
  (this->m_sys).d.d = (Data *)0x0;
  (this->m_sys).d.ptr = (char16_t *)0x0;
  (this->m_sys).d.size = 0;
  (this->m_pub).d.d = (Data *)0x0;
  (this->m_pub).d.ptr = (char16_t *)0x0;
  (this->m_pub).d.size = 0;
  (this->m_notationName).d.d = (Data *)0x0;
  (this->m_notationName).d.ptr = (char16_t *)0x0;
  (this->m_notationName).d.size = 0;
  QString::operator=(&(this->super_QDomNodePrivate).name,aname);
  QString::operator=(&this->m_pub,pub);
  QString::operator=(&this->m_sys,sys);
  QString::operator=(&this->m_notationName,notation);
  return;
}

Assistant:

QDomEntityPrivate::QDomEntityPrivate(QDomDocumentPrivate* d, QDomNodePrivate* parent,
                                        const QString& aname,
                                        const QString& pub, const QString& sys, const QString& notation)
    : QDomNodePrivate(d, parent)
{
    name = aname;
    m_pub = pub;
    m_sys = sys;
    m_notationName = notation;
}